

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error ft_lookup_PS_in_sfnt_stream
                   (FT_Stream stream,FT_Long face_index,FT_ULong *offset,FT_ULong *length,
                   FT_Bool *is_sfnt_cid)

{
  FT_UInt32 FVar1;
  FT_UInt32 FVar2;
  int local_54;
  int i;
  FT_ULong tag;
  FT_Long pstable_index;
  FT_UShort numTables;
  FT_Bool *pFStack_38;
  FT_Error error;
  FT_Bool *is_sfnt_cid_local;
  FT_ULong *length_local;
  FT_ULong *offset_local;
  FT_Long face_index_local;
  FT_Stream stream_local;
  
  *offset = 0;
  *length = 0;
  *is_sfnt_cid = '\0';
  pFStack_38 = is_sfnt_cid;
  is_sfnt_cid_local = (FT_Bool *)length;
  length_local = offset;
  offset_local = (FT_ULong *)face_index;
  face_index_local = (FT_Long)stream;
  FVar1 = FT_Stream_ReadULong(stream,(FT_Error *)((long)&pstable_index + 4));
  if (pstable_index._4_4_ == 0) {
    if (FVar1 == 0x74797031) {
      pstable_index._2_2_ =
           FT_Stream_ReadUShort((FT_Stream)face_index_local,(FT_Error *)((long)&pstable_index + 4));
      if (pstable_index._4_4_ == 0) {
        stream_local._4_4_ = FT_Stream_Skip((FT_Stream)face_index_local,6);
        if (stream_local._4_4_ == 0) {
          tag = 0xffffffffffffffff;
          *pFStack_38 = '\0';
          pstable_index._4_4_ = 0;
          for (local_54 = 0; local_54 < (int)(uint)pstable_index._2_2_; local_54 = local_54 + 1) {
            FVar1 = FT_Stream_ReadULong((FT_Stream)face_index_local,
                                        (FT_Error *)((long)&pstable_index + 4));
            if ((pstable_index._4_4_ != 0) ||
               (pstable_index._4_4_ = FT_Stream_Skip((FT_Stream)face_index_local,4),
               pstable_index._4_4_ != 0)) {
              return pstable_index._4_4_;
            }
            FVar2 = FT_Stream_ReadULong((FT_Stream)face_index_local,
                                        (FT_Error *)((long)&pstable_index + 4));
            *length_local = (ulong)FVar2;
            if (pstable_index._4_4_ != 0) {
              return pstable_index._4_4_;
            }
            FVar2 = FT_Stream_ReadULong((FT_Stream)face_index_local,
                                        (FT_Error *)((long)&pstable_index + 4));
            *(ulong *)is_sfnt_cid_local = (ulong)FVar2;
            if (pstable_index._4_4_ != 0) {
              return pstable_index._4_4_;
            }
            if (FVar1 == 0x43494420) {
              tag = tag + 1;
              *length_local = *length_local + 0x16;
              *(long *)is_sfnt_cid_local = *(long *)is_sfnt_cid_local + -0x16;
              *pFStack_38 = '\x01';
              if ((long)offset_local < 0) {
                return 0;
              }
            }
            else if (FVar1 == 0x54595031) {
              tag = tag + 1;
              *length_local = *length_local + 0x18;
              *(long *)is_sfnt_cid_local = *(long *)is_sfnt_cid_local + -0x18;
              *pFStack_38 = '\0';
              if ((long)offset_local < 0) {
                return 0;
              }
            }
            if ((-1 < (long)offset_local) && ((FT_ULong *)tag == offset_local)) {
              return 0;
            }
          }
          stream_local._4_4_ = 0x8e;
        }
      }
      else {
        stream_local._4_4_ = pstable_index._4_4_;
      }
    }
    else {
      stream_local._4_4_ = 2;
    }
  }
  else {
    stream_local._4_4_ = pstable_index._4_4_;
  }
  return stream_local._4_4_;
}

Assistant:

static FT_Error
  ft_lookup_PS_in_sfnt_stream( FT_Stream  stream,
                               FT_Long    face_index,
                               FT_ULong*  offset,
                               FT_ULong*  length,
                               FT_Bool*   is_sfnt_cid )
  {
    FT_Error   error;
    FT_UShort  numTables;
    FT_Long    pstable_index;
    FT_ULong   tag;
    int        i;


    *offset = 0;
    *length = 0;
    *is_sfnt_cid = FALSE;

    /* TODO: support for sfnt-wrapped PS/CID in TTC format */

    /* version check for 'typ1' (should be ignored?) */
    if ( FT_READ_ULONG( tag ) )
      return error;
    if ( tag != TTAG_typ1 )
      return FT_THROW( Unknown_File_Format );

    if ( FT_READ_USHORT( numTables ) )
      return error;
    if ( FT_STREAM_SKIP( 2 * 3 ) ) /* skip binary search header */
      return error;

    pstable_index = -1;
    *is_sfnt_cid  = FALSE;

    for ( i = 0; i < numTables; i++ )
    {
      if ( FT_READ_ULONG( tag )     || FT_STREAM_SKIP( 4 )      ||
           FT_READ_ULONG( *offset ) || FT_READ_ULONG( *length ) )
        return error;

      if ( tag == TTAG_CID )
      {
        pstable_index++;
        *offset += 22;
        *length -= 22;
        *is_sfnt_cid = TRUE;
        if ( face_index < 0 )
          return FT_Err_Ok;
      }
      else if ( tag == TTAG_TYP1 )
      {
        pstable_index++;
        *offset += 24;
        *length -= 24;
        *is_sfnt_cid = FALSE;
        if ( face_index < 0 )
          return FT_Err_Ok;
      }
      if ( face_index >= 0 && pstable_index == face_index )
        return FT_Err_Ok;
    }

    return FT_THROW( Table_Missing );
  }